

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des_key_check_key_parity(uchar *key)

{
  int local_1c;
  int i;
  uchar *key_local;
  
  local_1c = 0;
  while( true ) {
    if (7 < local_1c) {
      return 0;
    }
    if (key[local_1c] != odd_parity_table[(int)(key[local_1c] / 2)]) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int mbedtls_des_key_check_key_parity( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < MBEDTLS_DES_KEY_SIZE; i++ )
        if( key[i] != odd_parity_table[key[i] / 2] )
            return( 1 );

    return( 0 );
}